

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O0

void __thiscall
btConeTwistConstraint::computeConeLimitInfo
          (btConeTwistConstraint *this,btQuaternion *qCone,btScalar *swingAngle,
          btVector3 *vSwingAxis,btScalar *swingLimit)

{
  float fVar1;
  btScalar *pbVar2;
  btVector3 *this_00;
  btScalar *_z;
  btVector3 *in_RCX;
  float *in_RDX;
  btQuadWord *in_RSI;
  long in_RDI;
  undefined4 *in_R8;
  btScalar bVar3;
  float fVar4;
  double dVar5;
  btScalar swingLimit2;
  btScalar norm;
  btScalar surfaceSlope2;
  btScalar yEllipse;
  btScalar xEllipse;
  btQuaternion *in_stack_ffffffffffffffa0;
  btVector3 local_38;
  undefined4 *local_28;
  btVector3 *local_20;
  float *local_18;
  btQuadWord *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar3 = btQuaternion::getAngle(in_stack_ffffffffffffffa0);
  *local_18 = bVar3;
  if (1.1920929e-07 < *local_18) {
    pbVar2 = btQuadWord::x(local_10);
    this_00 = (btVector3 *)btQuadWord::y(local_10);
    _z = btQuadWord::z(local_10);
    btVector3::btVector3(&local_38,pbVar2,this_00->m_floats,_z);
    *(undefined8 *)local_20->m_floats = local_38.m_floats._0_8_;
    *(undefined8 *)(local_20->m_floats + 2) = local_38.m_floats._8_8_;
    btVector3::normalize(this_00);
    pbVar2 = btVector3::y(local_20);
    fVar4 = *pbVar2;
    pbVar2 = btVector3::z(local_20);
    fVar1 = *pbVar2;
    *local_28 = *(undefined4 *)(in_RDI + 0x1d4);
    dVar5 = std::fabs((double)(ulong)(uint)fVar4);
    if (1.1920929e-07 < SUB84(dVar5,0)) {
      fVar4 = (-fVar1 * -fVar1) / (fVar4 * fVar4);
      dVar5 = std::sqrt((double)(ulong)(uint)((fVar4 + 1.0) /
                                             (fVar4 / (*(float *)(in_RDI + 0x1d4) *
                                                      *(float *)(in_RDI + 0x1d4)) +
                                             1.0 / (*(float *)(in_RDI + 0x1d8) *
                                                   *(float *)(in_RDI + 0x1d8)))));
      *local_28 = SUB84(dVar5,0);
    }
  }
  return;
}

Assistant:

void btConeTwistConstraint::computeConeLimitInfo(const btQuaternion& qCone,
												 btScalar& swingAngle, // out
												 btVector3& vSwingAxis, // out
												 btScalar& swingLimit) // out
{
	swingAngle = qCone.getAngle();
	if (swingAngle > SIMD_EPSILON)
	{
		vSwingAxis = btVector3(qCone.x(), qCone.y(), qCone.z());
		vSwingAxis.normalize();
#if 0
        // non-zero twist?! this should never happen.
       btAssert(fabs(vSwingAxis.x()) <= SIMD_EPSILON));
#endif
        
		// Compute limit for given swing. tricky:
		// Given a swing axis, we're looking for the intersection with the bounding cone ellipse.
		// (Since we're dealing with angles, this ellipse is embedded on the surface of a sphere.)

		// For starters, compute the direction from center to surface of ellipse.
		// This is just the perpendicular (ie. rotate 2D vector by PI/2) of the swing axis.
		// (vSwingAxis is the cone rotation (in z,y); change vars and rotate to (x,y) coords.)
		btScalar xEllipse =  vSwingAxis.y();
		btScalar yEllipse = -vSwingAxis.z();

		// Now, we use the slope of the vector (using x/yEllipse) and find the length
		// of the line that intersects the ellipse:
		//  x^2   y^2
		//  --- + --- = 1, where a and b are semi-major axes 2 and 1 respectively (ie. the limits)
		//  a^2   b^2
		// Do the math and it should be clear.

		swingLimit = m_swingSpan1; // if xEllipse == 0, we have a pure vSwingAxis.z rotation: just use swingspan1
		if (fabs(xEllipse) > SIMD_EPSILON)
		{
			btScalar surfaceSlope2 = (yEllipse*yEllipse)/(xEllipse*xEllipse);
			btScalar norm = 1 / (m_swingSpan2 * m_swingSpan2);
			norm += surfaceSlope2 / (m_swingSpan1 * m_swingSpan1);
			btScalar swingLimit2 = (1 + surfaceSlope2) / norm;
			swingLimit = sqrt(swingLimit2);
		}

		// test!
		/*swingLimit = m_swingSpan2;
		if (fabs(vSwingAxis.z()) > SIMD_EPSILON)
		{
		btScalar mag_2 = m_swingSpan1*m_swingSpan1 + m_swingSpan2*m_swingSpan2;
		btScalar sinphi = m_swingSpan2 / sqrt(mag_2);
		btScalar phi = asin(sinphi);
		btScalar theta = atan2(fabs(vSwingAxis.y()),fabs(vSwingAxis.z()));
		btScalar alpha = 3.14159f - theta - phi;
		btScalar sinalpha = sin(alpha);
		swingLimit = m_swingSpan1 * sinphi/sinalpha;
		}*/
	}
	else if (swingAngle < 0)
	{
		// this should never happen!
#if 0
        btAssert(0);
#endif
 	}
}